

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O1

void __thiscall
cube::net::TcpConnection::ReadUntil(TcpConnection *this,string *delimiter,ReadCallback *cb)

{
  EventLoop *this_00;
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_70;
  code *local_60;
  undefined8 uStack_58;
  Buffer *local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
    __assert_fail("cb",
                  "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/net/tcp_connection.cpp"
                  ,0x4a,
                  "void cube::net::TcpConnection::ReadUntil(const std::string &, const ReadCallback &)"
                 );
  }
  if (delimiter->_M_string_length != 0) {
    if (this->m_state != ConnState_Disconnected) {
      pcVar3 = Buffer::Find(&this->m_input_buffer,delimiter);
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::_M_assign((string *)&this->m_read_delimiter);
        std::function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>::operator=
                  (&this->m_read_callback,cb);
        if ((((this->m_eventor)._M_t.
              super___uniq_ptr_impl<cube::net::Eventor,_std::default_delete<cube::net::Eventor>_>.
              _M_t.
              super__Tuple_impl<0UL,_cube::net::Eventor_*,_std::default_delete<cube::net::Eventor>_>
              .super__Head_base<0UL,_cube::net::Eventor_*,_false>._M_head_impl)->m_events & 1) == 0)
        {
          EnableReading(this);
          return;
        }
      }
      else {
        this_00 = this->m_event_loop;
        std::__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<cube::net::TcpConnection,void>
                  ((__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_38,
                   (__weak_ptr<cube::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
        std::function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>::function
                  ((function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)> *)
                   &local_70,cb);
        p_Var2 = p_Stack_30;
        uVar1 = local_38;
        local_48 = local_38;
        local_40 = p_Stack_30;
        local_38 = 0;
        p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_88 = (code *)0x0;
        pcStack_80 = (code *)0x0;
        local_50 = &this->m_input_buffer;
        local_98._M_unused._M_object = operator_new(0x38);
        *(undefined8 *)local_98._M_unused._0_8_ = 0;
        *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
        *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x10) = 0;
        *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x18) = uStack_58;
        if (local_60 != (code *)0x0) {
          *(void **)local_98._M_unused._0_8_ = local_70._M_unused._M_object;
          *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_70._8_8_;
          *(code **)((long)local_98._M_unused._0_8_ + 0x10) = local_60;
          local_60 = (code *)0x0;
          uStack_58 = 0;
        }
        *(Buffer **)((long)local_98._M_unused._0_8_ + 0x20) = local_50;
        *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x28) = uVar1;
        *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x30) = 0;
        local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_98._M_unused._0_8_ + 0x30) =
             p_Var2;
        local_48 = 0;
        pcStack_80 = std::
                     _Function_handler<void_(),_std::_Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>_>
                     ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(),_std::_Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>_>
                   ::_M_manager;
        EventLoop::Post(this_00,(Task *)&local_98);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
        if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
        }
        if (local_60 != (code *)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
        }
      }
    }
    return;
  }
  __assert_fail("!delimiter.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/net/tcp_connection.cpp"
                ,0x4b,
                "void cube::net::TcpConnection::ReadUntil(const std::string &, const ReadCallback &)"
               );
}

Assistant:

void TcpConnection::ReadUntil(const std::string &delimiter, const ReadCallback &cb) {
    assert(cb);
    assert(!delimiter.empty());
    if (Closed()) return;
    if (m_input_buffer.Find(delimiter) != NULL) {
        m_event_loop->Post(std::bind(cb, shared_from_this(), &m_input_buffer));
        return;
    }
    m_read_delimiter = delimiter;
    m_read_callback = cb;
    if (!m_eventor->Reading()) {
        EnableReading();
    }
    return;
}